

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O2

uint32_t helper_uqsubaddx_arm(uint32_t a,uint32_t b)

{
  ushort uVar1;
  uint uVar2;
  ushort uVar3;
  
  uVar1 = (ushort)(b >> 0x10);
  uVar3 = 0xffff;
  if (!CARRY2(uVar1,(ushort)a)) {
    uVar3 = uVar1 + (ushort)a;
  }
  uVar1 = (ushort)(a >> 0x10);
  uVar2 = 0;
  if ((ushort)b <= uVar1) {
    uVar2 = (uint)(ushort)(uVar1 - (ushort)b);
  }
  return uVar2 << 0x10 | (uint)uVar3;
}

Assistant:

uint32_t HELPER(glue(PFX,subaddx))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    ADD16(a, b >> 16, 0);
    SUB16(a >> 16, b, 1);
    SET_GE;
    return res;
}